

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

opj_image_t * tgatoimage(char *filename,opj_cparameters_t *parameters)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  opj_image_comp_t *poVar5;
  uint uVar6;
  FILE *__stream;
  size_t sVar7;
  void *__ptr;
  long lVar8;
  opj_image_t *poVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char *__ptr_00;
  ulong uVar13;
  int iVar14;
  size_t sStack_100;
  char ch;
  uchar b;
  uchar g;
  byte local_e6;
  uchar a;
  uint local_e4;
  opj_cparameters_t *local_e0;
  ulong local_d8;
  ulong local_d0;
  opj_image_cmptparm_t cmptparm [4];
  
  local_e0 = parameters;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    return (opj_image_t *)0x0;
  }
  sVar7 = fread(cmptparm,0x12,1,__stream);
  if (sVar7 == 1) {
    uVar13 = (ulong)(byte)cmptparm[0].dx;
    local_e6 = cmptparm[0].x0._1_1_;
    local_d8 = (ulong)(ushort)cmptparm[0].h;
    local_d0 = (ulong)cmptparm[0].h._2_2_;
    local_e4 = (uint)(byte)cmptparm[0].x0;
    if (uVar13 != 0) {
      __ptr = malloc(uVar13);
      if (__ptr == (void *)0x0) {
        __ptr_00 = "tga_readheader: memory out\n";
        sStack_100 = 0x1b;
        goto LAB_0010773a;
      }
      sVar7 = fread(__ptr,uVar13,1,__stream);
      if (sVar7 == 0) {
        fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,
               _stderr);
        free(__ptr);
        goto LAB_00107743;
      }
      free(__ptr);
    }
    uVar13 = local_d0;
    iVar11 = (int)local_d0;
    if (cmptparm[0].dx._2_1_ < 9) {
      uVar10 = (uint)(cmptparm[0].dy._3_1_ >> 3) * (uint)cmptparm[0].dy._1_2_;
      if (uVar10 != 0) {
        fwrite("File contains a palette - not yet supported.",0x2c,1,_stderr);
        fseek(__stream,(ulong)uVar10,1);
      }
      uVar10 = local_e4;
      if ((local_e4 == 0x18) || (local_e4 == 0x20)) {
        memset(cmptparm,0,0x90);
        uVar10 = (uVar10 == 0x20) + 3;
        if ((iVar11 != 0) &&
           ((uint)((10000000 / (uVar13 & 0xffffffff)) / (ulong)uVar10) < (uint)local_d8)) {
          uVar13 = (ulong)uVar10 * (uVar13 & 0xffffffff) * (local_d8 & 0xffffffff);
          lVar8 = ftell(__stream);
          if (0x7ffffffe < uVar13) {
            uVar13 = 0x7fffffff;
          }
          fseek(__stream,uVar13 - 1,0);
          sVar7 = fread(&ch,1,1,__stream);
          if (sVar7 != 1) goto LAB_00107743;
          fseek(__stream,lVar8,0);
          iVar11 = (int)local_d0;
        }
        uVar13 = local_d8;
        iVar1 = local_e0->subsampling_dx;
        iVar2 = local_e0->subsampling_dy;
        for (lVar8 = 0; iVar14 = (int)local_d8, (ulong)uVar10 * 0x24 - lVar8 != 0;
            lVar8 = lVar8 + 0x24) {
          *(undefined4 *)((long)&cmptparm[0].prec + lVar8) = 8;
          *(undefined4 *)((long)&cmptparm[0].sgnd + lVar8) = 0;
          *(int *)((long)&cmptparm[0].dx + lVar8) = iVar1;
          *(int *)((long)&cmptparm[0].dy + lVar8) = iVar2;
          *(int *)((long)&cmptparm[0].w + lVar8) = iVar14;
          *(int *)((long)&cmptparm[0].h + lVar8) = iVar11;
        }
        poVar9 = (opj_image_t *)opj_image_create(uVar10,cmptparm,1);
        if (poVar9 != (opj_image_t *)0x0) {
          OVar3 = local_e0->image_offset_x0;
          poVar9->x0 = OVar3;
          OVar4 = local_e0->image_offset_y0;
          poVar9->y0 = OVar4;
          poVar9->x1 = OVar3 + iVar1 * (iVar14 + -1) + 1;
          poVar9->y1 = OVar4 + iVar2 * ((int)local_d0 + -1) + 1;
          uVar10 = 0;
          do {
            if (uVar10 == (uint)local_d0) {
              fclose(__stream);
              return poVar9;
            }
            local_e0 = (opj_cparameters_t *)CONCAT44(local_e0._4_4_,uVar10);
            uVar6 = ~uVar10 + (uint)local_d0;
            if ((local_e6 & 0x20) != 0) {
              uVar6 = uVar10;
            }
            lVar8 = (long)(int)(uVar6 * (int)uVar13);
            uVar12 = uVar13 & 0xffffffff;
            if (local_e4 == 0x20) {
              while (iVar11 = (int)uVar13, uVar13 = (ulong)(iVar11 - 1), iVar11 != 0) {
                sVar7 = fread(&b,1,1,__stream);
                if (((sVar7 == 0) || (sVar7 = fread(&g,1,1,__stream), sVar7 == 0)) ||
                   ((sVar7 = fread(&ch,1,1,__stream), sVar7 == 0 ||
                    (sVar7 = fread(&a,1,1,__stream), sVar7 == 0)))) goto LAB_00107679;
                poVar5 = poVar9->comps;
                poVar5->data[lVar8] = (uint)(byte)ch;
                poVar5[1].data[lVar8] = (uint)g;
                poVar5[2].data[lVar8] = (uint)b;
                poVar5[3].data[lVar8] = (uint)a;
                lVar8 = lVar8 + 1;
              }
            }
            else {
              while (iVar11 = (int)uVar12, uVar12 = (ulong)(iVar11 - 1), iVar11 != 0) {
                sVar7 = fread(&b,1,1,__stream);
                if (((sVar7 == 0) || (sVar7 = fread(&g,1,1,__stream), sVar7 == 0)) ||
                   (sVar7 = fread(&ch,1,1,__stream), sVar7 == 0)) goto LAB_00107679;
                poVar5 = poVar9->comps;
                poVar5->data[lVar8] = (uint)(byte)ch;
                poVar5[1].data[lVar8] = (uint)g;
                poVar5[2].data[lVar8] = (uint)b;
                lVar8 = lVar8 + 1;
              }
            }
            uVar10 = (int)local_e0 + 1;
            uVar13 = local_d8;
          } while( true );
        }
      }
      goto LAB_00107743;
    }
    __ptr_00 = "Sorry, compressed tga files are not currently supported.\n";
    sStack_100 = 0x39;
  }
  else {
    __ptr_00 = "\nError: fread return a number of element different from the expected.\n";
    sStack_100 = 0x46;
  }
LAB_0010773a:
  fwrite(__ptr_00,sStack_100,1,_stderr);
LAB_00107743:
  fclose(__stream);
  return (opj_image_t *)0x0;
LAB_00107679:
  fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,_stderr);
  opj_image_destroy(poVar9);
  goto LAB_00107743;
}

Assistant:

opj_image_t* tgatoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f;
    opj_image_t *image;
    unsigned int image_width, image_height, pixel_bit_depth;
    unsigned int x, y;
    int flip_image = 0;
    opj_image_cmptparm_t cmptparm[4];   /* maximum 4 components */
    int numcomps;
    OPJ_COLOR_SPACE color_space;
    OPJ_BOOL mono ;
    OPJ_BOOL save_alpha;
    int subsampling_dx, subsampling_dy;
    int i;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return 0;
    }

    if (!tga_readheader(f, &pixel_bit_depth, &image_width, &image_height,
                        &flip_image)) {
        fclose(f);
        return NULL;
    }

    /* We currently only support 24 & 32 bit tga's ... */
    if (!((pixel_bit_depth == 24) || (pixel_bit_depth == 32))) {
        fclose(f);
        return NULL;
    }

    /* initialize image components */
    memset(&cmptparm[0], 0, 4 * sizeof(opj_image_cmptparm_t));

    mono = (pixel_bit_depth == 8) ||
           (pixel_bit_depth == 16);  /* Mono with & without alpha. */
    save_alpha = (pixel_bit_depth == 16) ||
                 (pixel_bit_depth == 32); /* Mono with alpha, or RGB with alpha */

    if (mono) {
        color_space = OPJ_CLRSPC_GRAY;
        numcomps = save_alpha ? 2 : 1;
    } else {
        numcomps = save_alpha ? 4 : 3;
        color_space = OPJ_CLRSPC_SRGB;
    }

    /* If the declared file size is > 10 MB, check that the file is big */
    /* enough to avoid excessive memory allocations */
    if (image_height != 0 &&
            image_width > 10000000U / image_height / (OPJ_UINT32)numcomps) {
        char ch;
        OPJ_UINT64 expected_file_size =
            (OPJ_UINT64)image_width * image_height * (OPJ_UINT32)numcomps;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = image_width;
        cmptparm[i].h = image_height;
    }

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(f);
        return NULL;
    }


    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = !image->x0 ? (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1 : image->x0 + (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = !image->y0 ? (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1 : image->y0 + (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    /* set image data */
    for (y = 0; y < image_height; y++) {
        int index;

        if (flip_image) {
            index = (int)((image_height - y - 1) * image_width);
        } else {
            index = (int)(y * image_width);
        }

        if (numcomps == 3) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b;

                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                index++;
            }
        } else if (numcomps == 4) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b, a;
                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&a, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                image->comps[3].data[index] = a;
                index++;
            }
        } else {
            fprintf(stderr, "Currently unsupported bit depth : %s\n", filename);
        }
    }
    fclose(f);
    return image;
}